

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O3

int h264_ref_idx(bitstream *str,h264_cabac_context *cabac,int idx,int which,int max,uint32_t *val)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  h264_macroblock *phVar4;
  h264_macroblock *phVar5;
  h264_macroblock *phVar6;
  uint uVar7;
  uint uVar8;
  int idxB;
  int idxA;
  int ctxIdx [3];
  int local_50;
  int local_4c;
  uint32_t *local_48;
  int local_3c [3];
  
  if (max == 0) {
    iVar2 = vs_infer(str,val,0);
    return iVar2;
  }
  if (cabac == (h264_cabac_context *)0x0) {
    if (max != 1) {
      iVar2 = vs_ue(str,val);
      return iVar2;
    }
    uVar1 = *val;
    iVar2 = 1;
    iVar3 = vs_u(str,val,1);
    if (iVar3 == 0) {
      *val = uVar1;
      iVar2 = 0;
    }
  }
  else {
    local_48 = val;
    phVar4 = h264_mb_nb(cabac->slice,H264_MB_THIS,0);
    phVar5 = h264_mb_nb_b(cabac->slice,H264_MB_A,H264_BLOCK_8X8,0,idx,&local_4c);
    phVar6 = h264_mb_nb_b(cabac->slice,H264_MB_B,H264_BLOCK_8X8,0,idx,&local_50);
    uVar8 = 0;
    uVar7 = 0;
    if (phVar4->mb_field_decoding_flag == 0) {
      uVar8 = (uint)(phVar5->mb_field_decoding_flag != 0);
      uVar7 = (uint)(phVar6->mb_field_decoding_flag != 0);
    }
    local_3c[0] = (uint)(uVar8 < phVar5->ref_idx[which][local_4c]) +
                  (uint)(uVar7 < phVar6->ref_idx[which][local_50]) * 2 + 0x36;
    local_3c[1] = 0x3a;
    local_3c[2] = 0x3b;
    iVar2 = h264_cabac_tu(str,cabac,local_3c,3,0xffffffff,local_48);
  }
  return iVar2;
}

Assistant:

int h264_ref_idx(struct bitstream *str, struct h264_cabac_context *cabac, int idx, int which, int max, uint32_t *val) {
	if (!max)
		return vs_infer(str, val, 0);
	if (!cabac) {
		if (max == 1) {
			uint32_t tmp = 1 - *val;
			if (vs_u(str, val, 1)) return 1;
			*val = 1 - tmp;
			return 0;
		} else {
			return vs_ue(str, val);
		}
	}
	int idxA, idxB;
	const struct h264_macroblock *mbT = h264_mb_nb(cabac->slice, H264_MB_THIS, 0);
	const struct h264_macroblock *mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_8X8, 0, idx, &idxA);
	const struct h264_macroblock *mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_8X8, 0, idx, &idxB);
	int thrA, thrB;
	thrA = (!mbT->mb_field_decoding_flag && mbA->mb_field_decoding_flag);
	thrB = (!mbT->mb_field_decoding_flag && mbB->mb_field_decoding_flag);
	int condTermFlagA = mbA->ref_idx[which][idxA] > thrA;
	int condTermFlagB = mbB->ref_idx[which][idxB] > thrB;
	int ctxIdx[3];
	ctxIdx[0] = H264_CABAC_CTXIDX_REF_IDX + condTermFlagA + 2 * condTermFlagB;
	ctxIdx[1] = H264_CABAC_CTXIDX_REF_IDX + 4;
	ctxIdx[2] = H264_CABAC_CTXIDX_REF_IDX + 5;
	return h264_cabac_tu(str, cabac, ctxIdx, 3, -1, val);
}